

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O2

void test_subtract(void)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  quicly_ranges_t ranges;
  
  ranges.ranges = &ranges._initial;
  ranges.num_ranges = 0;
  ranges.capacity = 1;
  iVar1 = quicly_ranges_add(&ranges,100,200);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x69
     );
  iVar1 = quicly_ranges_subtract(&ranges,0,0x32);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x6c
     );
  _ok((uint)(ranges.num_ranges == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x6d
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) == 100),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x6d);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) == 200),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x6d);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0,100);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x70
     );
  _ok((uint)(ranges.num_ranges == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x71
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) == 100),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x71);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) == 200),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x71);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0xfa,300);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x74
     );
  _ok((uint)(ranges.num_ranges == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x75
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) == 100),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x75);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) == 200),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x75);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,200,300);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x78
     );
  _ok((uint)(ranges.num_ranges == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x79
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) == 100),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x79);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) == 200),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x79);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,100,0x6e);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x7c
     );
  _ok((uint)(ranges.num_ranges == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x7d
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) == 0x6e),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x7d);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) == 200),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x7d);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x78,0x82);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x80
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x81
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x81);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x81);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x78,0x82);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x84
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x85
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x85);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x85);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x79,0x81);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x88
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x89
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x89);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x89);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x77,0x78);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x8c
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x8d
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected_3[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x8d);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected_3[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x8d);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x76,0x78);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x90
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x91
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected_4[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x91);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected_4[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x91);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x82,0x84);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x94
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x95
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected_5[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x95);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected_5[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x95);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x82,0x85);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x98
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x99
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected_6[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x99);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected_6[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x99);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x76,0x86);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x9c
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x9d
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected_7[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x9d);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected_7[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x9d);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x75,0x86);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa0
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa1
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected_8[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa1);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected_8[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa1);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x74,0x87);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa4
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa5
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected_9[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa5);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected_9[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa5);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x6e,0x8c);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa8
     );
  _ok((uint)(ranges.num_ranges == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa9
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) == 0x8c),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa9);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) == 200),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa9);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_add(&ranges,100,0x78);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xac
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xad
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected_10[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xad);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected_10[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xad);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x50,0x96);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb0
     );
  _ok((uint)(ranges.num_ranges == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb1
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) == 0x96),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb1);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) == 200),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb1);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_add(&ranges,100,0x78);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb4
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb5
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected_11[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb5);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected_11[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb5);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x76,200);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb8
     );
  _ok((uint)(ranges.num_ranges == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb9
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) == 100),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb9);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) == 0x76),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb9);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_add(&ranges,0x8c,200);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xbc
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xbd
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected_12[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xbd);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected_12[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xbd);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x76,0xf0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xc0
     );
  _ok((uint)(ranges.num_ranges == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xc1
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) == 100),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc1);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) == 0x76),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc1);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_add(&ranges,0x8c,200);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xc4
     );
  _ok((uint)(ranges.num_ranges == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xc5
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) ==
              *(long *)((long)&test_subtract::expected_12[0].start + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc5);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) ==
              *(long *)((long)&test_subtract::expected_12[0].end + lVar3)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc5);
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = quicly_ranges_subtract(&ranges,0x75,0xf0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",200)
  ;
  _ok((uint)(ranges.num_ranges == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xc9
     );
  lVar3 = 0;
  for (sVar2 = 0; sVar2 != ranges.num_ranges; sVar2 = sVar2 + 1) {
    _ok((uint)(*(long *)((long)&(ranges.ranges)->start + lVar3) == 100),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc9);
    _ok((uint)(*(long *)((long)&(ranges.ranges)->end + lVar3) == 0x75),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc9);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

static void test_subtract(void)
{
    quicly_ranges_t ranges;
    int ret;

    quicly_ranges_init(&ranges);

    ret = quicly_ranges_add(&ranges, 100, 200);
    ok(ret == 0);

    ret = quicly_ranges_subtract(&ranges, 0, 50);
    ok(ret == 0);
    CHECK({100, 200});

    ret = quicly_ranges_subtract(&ranges, 0, 100);
    ok(ret == 0);
    CHECK({100, 200});

    ret = quicly_ranges_subtract(&ranges, 250, 300);
    ok(ret == 0);
    CHECK({100, 200});

    ret = quicly_ranges_subtract(&ranges, 200, 300);
    ok(ret == 0);
    CHECK({100, 200});

    ret = quicly_ranges_subtract(&ranges, 100, 110);
    ok(ret == 0);
    CHECK({110, 200});

    ret = quicly_ranges_subtract(&ranges, 120, 130);
    ok(ret == 0);
    CHECK({110, 120}, {130, 200});

    ret = quicly_ranges_subtract(&ranges, 120, 130);
    ok(ret == 0);
    CHECK({110, 120}, {130, 200});

    ret = quicly_ranges_subtract(&ranges, 121, 129);
    ok(ret == 0);
    CHECK({110, 120}, {130, 200});

    ret = quicly_ranges_subtract(&ranges, 119, 120);
    ok(ret == 0);
    CHECK({110, 119}, {130, 200});

    ret = quicly_ranges_subtract(&ranges, 118, 120);
    ok(ret == 0);
    CHECK({110, 118}, {130, 200});

    ret = quicly_ranges_subtract(&ranges, 130, 132);
    ok(ret == 0);
    CHECK({110, 118}, {132, 200});

    ret = quicly_ranges_subtract(&ranges, 130, 133);
    ok(ret == 0);
    CHECK({110, 118}, {133, 200});

    ret = quicly_ranges_subtract(&ranges, 118, 134);
    ok(ret == 0);
    CHECK({110, 118}, {134, 200});

    ret = quicly_ranges_subtract(&ranges, 117, 134);
    ok(ret == 0);
    CHECK({110, 117}, {134, 200});

    ret = quicly_ranges_subtract(&ranges, 116, 135);
    ok(ret == 0);
    CHECK({110, 116}, {135, 200});

    ret = quicly_ranges_subtract(&ranges, 110, 140);
    ok(ret == 0);
    CHECK({140, 200});

    ret = quicly_ranges_add(&ranges, 100, 120);
    ok(ret == 0);
    CHECK({100, 120}, {140, 200});

    ret = quicly_ranges_subtract(&ranges, 80, 150);
    ok(ret == 0);
    CHECK({150, 200});

    ret = quicly_ranges_add(&ranges, 100, 120);
    ok(ret == 0);
    CHECK({100, 120}, {150, 200});

    ret = quicly_ranges_subtract(&ranges, 118, 200);
    ok(ret == 0);
    CHECK({100, 118});

    ret = quicly_ranges_add(&ranges, 140, 200);
    ok(ret == 0);
    CHECK({100, 118}, {140, 200});

    ret = quicly_ranges_subtract(&ranges, 118, 240);
    ok(ret == 0);
    CHECK({100, 118});

    ret = quicly_ranges_add(&ranges, 140, 200);
    ok(ret == 0);
    CHECK({100, 118}, {140, 200});

    ret = quicly_ranges_subtract(&ranges, 117, 240);
    ok(ret == 0);
    CHECK({100, 117});
}